

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O1

void __thiscall
vkt::pipeline::anon_unknown_0::MultisampleRenderer::~MultisampleRenderer(MultisampleRenderer *this)

{
  VkFence obj;
  DeviceInterface *pDVar1;
  VkCommandPool obj_00;
  VkPipelineLayout obj_01;
  Allocation *pAVar2;
  VkBuffer obj_02;
  VkShaderModule VVar3;
  VkFramebuffer obj_03;
  VkRenderPass obj_04;
  VkImageView VVar4;
  VkImage VVar5;
  
  this->_vptr_MultisampleRenderer = (_func_int **)&PTR__MultisampleRenderer_00d57628;
  obj.m_internal =
       (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,obj);
  }
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if ((this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkCommandBuffer_s *)0x0) {
    pDVar1 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
    ;
    (*pDVar1->_vptr_DeviceInterface[0x48])
              (pDVar1,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                      m_device,
               (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal,1);
  }
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  obj_00.m_internal =
       (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               obj_00);
  }
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector(&this->m_graphicsPipelines);
  obj_01.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_01);
  }
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  pAVar2 = (this->m_vertexBufferAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar2 != (Allocation *)0x0) {
    (*pAVar2->_vptr_Allocation[1])();
    (this->m_vertexBufferAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  obj_02.m_internal =
       (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
  ;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               obj_02);
  }
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  VVar3.m_internal =
       (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (VVar3.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data
                .deleter,VVar3);
  }
  (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  VVar3.m_internal =
       (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  if (VVar3.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
                deleter,VVar3);
  }
  (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = 0;
  (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_03.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_03.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_03);
  }
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  obj_04.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj_04.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj_04);
  }
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  VVar4.m_internal =
       (this->m_depthStencilAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
       object.m_internal;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_depthStencilAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.
                m_data.deleter,VVar4);
  }
  (this->m_depthStencilAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
  .m_device = (VkDevice)0x0;
  (this->m_depthStencilAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
  .m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_depthStencilAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_depthStencilAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter
  .m_deviceIface = (DeviceInterface *)0x0;
  pAVar2 = (this->m_depthStencilImageAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar2 != (Allocation *)0x0) {
    (*pAVar2->_vptr_Allocation[1])();
    (this->m_depthStencilImageAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  VVar5.m_internal =
       (this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
       m_internal;
  if (VVar5.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                deleter,VVar5);
  }
  (this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device
       = (VkDevice)0x0;
  (this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
       = 0;
  (this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  VVar4.m_internal =
       (this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.
                m_data.deleter,VVar4);
  }
  (this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  pAVar2 = (this->m_resolveImageAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar2 != (Allocation *)0x0) {
    (*pAVar2->_vptr_Allocation[1])();
    (this->m_resolveImageAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  VVar5.m_internal =
       (this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
  ;
  if (VVar5.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar5);
  }
  (this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  VVar4.m_internal =
       (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,VVar4);
  }
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  pAVar2 = (this->m_colorImageAlloc).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar2 != (Allocation *)0x0) {
    (*pAVar2->_vptr_Allocation[1])();
    (this->m_colorImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  VVar5.m_internal =
       (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
  if (VVar5.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               VVar5);
  }
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  return;
}

Assistant:

MultisampleRenderer::~MultisampleRenderer (void)
{
}